

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.hpp
# Opt level: O2

void __thiscall Preceptron::Construct(Preceptron *this,int inputNum)

{
  int iVar1;
  clock_t cVar2;
  ulong uVar3;
  size_type __new_size;
  ulong uVar4;
  
  cVar2 = clock();
  srand((uint)cVar2);
  __new_size = (size_type)inputNum;
  std::vector<double,_std::allocator<double>_>::resize(&this->weight,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->delta_weight,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->delta_bias,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->input,__new_size);
  iVar1 = rand();
  this->bias = (double)(iVar1 % 1000) / 1000.0;
  uVar3 = 0;
  uVar4 = (ulong)(uint)inputNum;
  if (inputNum < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = rand();
    (this->weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = (double)(iVar1 % 1000) / 1000.0;
    (this->delta_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = 0.0;
    (this->delta_bias).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = 0.0;
  }
  this->motivation = 0.2;
  this->learning_step = 1.2;
  this->useBias = false;
  return;
}

Assistant:

virtual void Construct(int inputNum) {
		srand(clock());
		weight.resize(inputNum);
		delta_weight.resize(inputNum);
		delta_bias.resize(inputNum);
		input.resize(inputNum);

		bias = (double)(rand() % 1000) / 1000;
		for (int i = 0; i < inputNum; i++) {
			weight[i] = (double)(rand() % 1000) / 1000;
			delta_weight[i] = 0.0;
			delta_bias[i] = 0.0;
		}

		motivation = 0.2;
		learning_step = 1.2;
		useBias = false;
	}